

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O3

BBox<1> Omega_h::get_bounding_box<1>(Mesh *mesh)

{
  int *piVar1;
  Vector<1> VVar2;
  BBox<1> BVar3;
  BBox<1> BVar4;
  Vector<1> local_40;
  Vector<1> local_38;
  Comm *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  Alloc *local_20 [2];
  
  Mesh::coords((Mesh *)local_20);
  BVar3 = find_bounding_box<1>((Reals *)local_20);
  if (((ulong)local_20[0] & 7) == 0 && local_20[0] != (Alloc *)0x0) {
    piVar1 = &local_20[0]->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20[0]);
      operator_delete(local_20[0],0x48);
    }
  }
  Mesh::comm(mesh);
  local_40 = BVar3.min.super_Few<double,_1>.array_[0];
  BVar4.min.super_Few<double,_1>.array_[0] =
       (Few<double,_1>)
       Comm::allreduce<double>(local_30,(double)local_40.super_Few<double,_1>.array_[0],OMEGA_H_MIN)
  ;
  local_38 = BVar3.max.super_Few<double,_1>.array_[0];
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  Mesh::comm(mesh);
  VVar2.super_Few<double,_1>.array_[0] =
       (Few<double,_1>)
       Comm::allreduce<double>(local_30,(double)local_38.super_Few<double,_1>.array_[0],OMEGA_H_MAX)
  ;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  BVar4.max.super_Few<double,_1>.array_[0] = VVar2.super_Few<double,_1>.array_[0];
  return BVar4;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}